

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

bool __thiscall
QAbstractScrollAreaPrivate::canStartScrollingAt(QAbstractScrollAreaPrivate *this,QPoint *startPos)

{
  QAbstractScrollArea *this_00;
  QAbstractSlider *pQVar1;
  QAbstractScrollAreaPrivate *in_RDI;
  QAbstractScrollArea *q;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = q_func(in_RDI);
  QAbstractScrollArea::viewport(this_00);
  QWidget::childAt((QWidget *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (QPoint *)in_RDI);
  pQVar1 = qobject_cast<QAbstractSlider*>((QObject *)0x499310);
  return pQVar1 == (QAbstractSlider *)0x0;
}

Assistant:

bool QAbstractScrollAreaPrivate::canStartScrollingAt(const QPoint &startPos) const
{
    Q_Q(const QAbstractScrollArea);

    // don't start scrolling on a QAbstractSlider
    if (qobject_cast<QAbstractSlider *>(q->viewport()->childAt(startPos)))
        return false;

    return true;
}